

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_rownumber_function.cpp
# Opt level: O3

void __thiscall
duckdb::WindowRowNumberGlobalState::~WindowRowNumberGlobalState(WindowRowNumberGlobalState *this)

{
  _Head_base<0UL,_duckdb::WindowTokenTree_*,_false> _Var1;
  
  (this->super_WindowExecutorGlobalState).super_WindowExecutorState._vptr_WindowExecutorState =
       (_func_int **)&PTR__WindowRowNumberGlobalState_02446d90;
  _Var1._M_head_impl =
       (this->token_tree).
       super_unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::WindowTokenTree_*,_std::default_delete<duckdb::WindowTokenTree>_>
       .super__Head_base<0UL,_duckdb::WindowTokenTree_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (WindowTokenTree *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_WindowMergeSortTree + 8))();
  }
  (this->token_tree).
  super_unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::WindowTokenTree_*,_std::default_delete<duckdb::WindowTokenTree>_>.
  super__Head_base<0UL,_duckdb::WindowTokenTree_*,_false>._M_head_impl = (WindowTokenTree *)0x0;
  (this->super_WindowExecutorGlobalState).super_WindowExecutorState._vptr_WindowExecutorState =
       (_func_int **)&PTR__WindowExecutorGlobalState_02446b68;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &(this->super_WindowExecutorGlobalState).arg_types);
  operator_delete(this);
  return;
}

Assistant:

WindowRowNumberGlobalState(const WindowRowNumberExecutor &executor, const idx_t payload_count,
	                           const ValidityMask &partition_mask, const ValidityMask &order_mask)
	    : WindowExecutorGlobalState(executor, payload_count, partition_mask, order_mask),
	      ntile_idx(executor.ntile_idx) {
		if (!executor.arg_order_idx.empty()) {
			use_framing = true;

			//	If the argument order is prefix of the partition ordering,
			//	then we can just use the partition ordering.
			auto &wexpr = executor.wexpr;
			auto &arg_orders = executor.wexpr.arg_orders;
			const auto optimize = ClientConfig::GetConfig(executor.context).enable_optimizer;
			if (!optimize || BoundWindowExpression::GetSharedOrders(wexpr.orders, arg_orders) != arg_orders.size()) {
				//	"The ROW_NUMBER function can be computed by disambiguating duplicate elements based on their
				//	position in the input data, such that two elements never compare as equal."
				token_tree = make_uniq<WindowTokenTree>(executor.context, executor.wexpr.arg_orders,
				                                        executor.arg_order_idx, payload_count, true);
			}
		}
	}